

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

state_status_t __thiscall
tchecker::zg::standard_semantics_t::prev
          (standard_semantics_t *this,db_t *dbm,clock_id_t dim,bool src_delay_allowed,
          clock_constraint_container_t *src_invariant,clock_constraint_container_t *guard,
          clock_reset_container_t *clkreset,bool tgt_delay_allowed,
          clock_constraint_container_t *tgt_invariant)

{
  status_t sVar1;
  undefined1 local_58 [8];
  clock_constraint_container_t resets_as_constraints;
  bool tgt_delay_allowed_local;
  clock_constraint_container_t *guard_local;
  clock_constraint_container_t *src_invariant_local;
  bool src_delay_allowed_local;
  clock_id_t dim_local;
  db_t *dbm_local;
  standard_semantics_t *this_local;
  
  resets_as_constraints.
  super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = tgt_delay_allowed;
  sVar1 = tchecker::dbm::constrain(dbm,dim,tgt_invariant);
  if (sVar1 == EMPTY) {
    return 0x100;
  }
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::vector
            ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
             local_58);
  clock_resets_to_constraints
            (clkreset,(vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                       *)local_58);
  sVar1 = tchecker::dbm::constrain(dbm,dim,(clock_constraint_container_t *)local_58);
  if (sVar1 == EMPTY) {
    this_local._4_4_ = 0x200;
  }
  else {
    tchecker::dbm::free_clock(dbm,dim,clkreset);
    sVar1 = tchecker::dbm::constrain(dbm,dim,guard);
    if (sVar1 == EMPTY) {
      this_local._4_4_ = 0x40;
    }
    else {
      sVar1 = tchecker::dbm::constrain(dbm,dim,src_invariant);
      if (sVar1 == EMPTY) {
        this_local._4_4_ = 0x80;
      }
      else {
        if (src_delay_allowed) {
          tchecker::dbm::open_down(dbm,dim);
          sVar1 = tchecker::dbm::constrain(dbm,dim,src_invariant);
          if (sVar1 == EMPTY) {
            this_local._4_4_ = 0x80;
            goto LAB_002103e8;
          }
        }
        this_local._4_4_ = 1;
      }
    }
  }
LAB_002103e8:
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::~vector
            ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
             local_58);
  return this_local._4_4_;
}

Assistant:

tchecker::state_status_t standard_semantics_t::prev(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, bool src_delay_allowed,
                                                    tchecker::clock_constraint_container_t const & src_invariant,
                                                    tchecker::clock_constraint_container_t const & guard,
                                                    tchecker::clock_reset_container_t const & clkreset, bool tgt_delay_allowed,
                                                    tchecker::clock_constraint_container_t const & tgt_invariant)
{
  // prev(dbm) = free_clocks(dbm & tgt_invariant & constraints(clkreset), left_clocks(clkreset)) & guard & src_invariant
  // finally, if src_delay_allowed: opened down and intersected with src_invariant again
  if (tchecker::dbm::constrain(dbm, dim, tgt_invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_TGT_INVARIANT_VIOLATED;

  tchecker::clock_constraint_container_t resets_as_constraints;
  tchecker::clock_resets_to_constraints(clkreset, resets_as_constraints);
  if (tchecker::dbm::constrain(dbm, dim, resets_as_constraints) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_RESET_FAILED;

  tchecker::dbm::free_clock(dbm, dim, clkreset);

  if (tchecker::dbm::constrain(dbm, dim, guard) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_GUARD_VIOLATED;

  if (tchecker::dbm::constrain(dbm, dim, src_invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  if (src_delay_allowed) {
    tchecker::dbm::open_down(dbm, dim);

    if (tchecker::dbm::constrain(dbm, dim, src_invariant) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;
  }

  return tchecker::STATE_OK;
}